

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UndoMove.cpp
# Opt level: O3

void __thiscall UndoMove::PutMove(UndoMove *this,Move move,size_t row,size_t col)

{
  _Map_pointer ppuVar1;
  unsigned_long local_28;
  
  ppuVar1 = (this->moveStack).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->moveStack).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->moveStack).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(this->moveStack).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->moveStack).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppuVar1 -
                (long)(this->moveStack).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40 == 10) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->moveStack);
  }
  switch(move) {
  case UP:
    local_28 = (col + row * 10) - 10;
    break;
  case RIGHT:
    local_28 = col + row * 10 + 1;
    break;
  case DOWN:
    local_28 = col + row * 10 + 10;
    break;
  case LEFT:
    local_28 = (col + row * 10) - 1;
    break;
  default:
    goto switchD_0010f5be_default;
  }
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->moveStack,&local_28);
switchD_0010f5be_default:
  return;
}

Assistant:

void UndoMove::PutMove( Move move, size_t row, size_t col )
{
    if ( moveStack.size() == MOVE_STACK_LIMIT )
    {
        moveStack.pop_front();
    }

    switch ( move )
    {
        case Move::UP:
            moveStack.push_back(( row - 1 ) * 10 + col );
            break;
        case Move::RIGHT:
            moveStack.push_back( row * 10 + col + 1 );
            break;
        case Move::DOWN:
            moveStack.push_back(( row + 1 ) * 10 + col );
            break;
        case Move::LEFT:
            moveStack.push_back( row * 10 + col -1  );
            break;
    }
}